

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

bool __thiscall
wasm::WasmBinaryBuilder::maybeVisitStringConcat
          (WasmBinaryBuilder *this,Expression **out,uint32_t code)

{
  Expression *right;
  Expression *left;
  StringConcat *pSVar1;
  Builder local_30;
  
  if (code == 0x88) {
    right = popNonVoidExpression(this);
    left = popNonVoidExpression(this);
    local_30.wasm = this->wasm;
    pSVar1 = Builder::makeStringConcat(&local_30,left,right);
    *out = (Expression *)pSVar1;
  }
  return code == 0x88;
}

Assistant:

bool WasmBinaryBuilder::maybeVisitStringConcat(Expression*& out,
                                               uint32_t code) {
  if (code != BinaryConsts::StringConcat) {
    return false;
  }
  auto* right = popNonVoidExpression();
  auto* left = popNonVoidExpression();
  out = Builder(wasm).makeStringConcat(left, right);
  return true;
}